

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.h
# Opt level: O1

void __thiscall
ForStatement::GenerateStatementInline(ForStatement *this,ostream *out,int n,StatementPtr *statement)

{
  char cVar1;
  element_type *peVar2;
  long lVar3;
  string text;
  ostringstream statementBuffer;
  long *local_1c0;
  ulong local_1b8;
  long local_1b0 [2];
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  peVar2 = (statement->super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (*peVar2->_vptr_Statement[1])(peVar2,local_1a0,0);
  std::__cxx11::stringbuf::str();
  while (local_1b8 != 0) {
    cVar1 = *(char *)((long)local_1c0 + (local_1b8 - 1));
    if ((cVar1 != ';') && (cVar1 != '\n')) {
      if (local_1b8 != 0) {
        goto LAB_0011fee5;
      }
      break;
    }
    std::__cxx11::string::resize((ulong)&local_1c0,(char)local_1b8 + -1);
  }
  goto LAB_0011ff1e;
  while( true ) {
    std::__cxx11::string::insert((ulong)&local_1c0,lVar3 + 1U,(char)n);
    if (local_1b8 <= lVar3 + 1U + (long)n) break;
LAB_0011fee5:
    lVar3 = std::__cxx11::string::find((char)&local_1c0,10);
    if (lVar3 == -1) break;
  }
LAB_0011ff1e:
  std::__ostream_insert<char,std::char_traits<char>>(out,(char *)local_1c0,local_1b8);
  if (local_1c0 != local_1b0) {
    operator_delete(local_1c0,local_1b0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::ios_base::~ios_base(local_130);
  return;
}

Assistant:

void GenerateStatementInline( std::ostream& out, int n, StatementPtr statement ) const
	{
		std::ostringstream statementBuffer;
		statement->GenerateCode(statementBuffer, 0);

		std::string text = statementBuffer.str();

		while (!text.empty() && (text[text.length()-1] == '\n' || text[text.length()-1] == ';'))
			text.resize(text.length()-1); //remove last element

		AssureIndents(text, n);

		out << text;
	}